

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.hpp
# Opt level: O2

node * __thiscall
boost::lockfree::detail::
fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node,boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node,std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node>>>
::construct<true,false,unsigned_short>
          (fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node,boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node,std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node>>>
           *this,unsigned_short *arg)

{
  index_t iVar1;
  node *pnVar2;
  
  iVar1 = fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
          ::allocate_impl((fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
                           *)this);
  if (iVar1 == *(index_t *)(this + 8)) {
    pnVar2 = (node *)0x0;
  }
  else {
    pnVar2 = (node *)(*(long *)this + (ulong)iVar1 * 0x40);
    *(uint *)(*(long *)this + (ulong)iVar1 * 0x40) = (uint)*arg;
  }
  return pnVar2;
}

Assistant:

T * construct (ArgumentType const & arg)
    {
        index_t node_index = allocate<ThreadSafe>();
        if (node_index == null_handle())
            return NULL;

        T * node = NodeStorage::nodes() + node_index;
        new(node) T(arg);
        return node;
    }